

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcrypt_pbkdf.c
# Opt level: O1

void bcrypt_hash(uint8_t *sha2pass,uint8_t *sha2salt,uint8_t *out)

{
  uint8_t *key;
  long lVar1;
  ushort uVar2;
  uint16_t keybytes;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  int iVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  uint32_t datar;
  uint32_t cdata [8];
  uint8_t ciphertext [32];
  blf_ctx state;
  uint32_t local_10dc;
  uint32_t local_10d8 [10];
  uint8_t *local_10b0;
  uint8_t *local_10a8;
  long local_10a0;
  byte local_1098 [32];
  blf_ctx local_1078;
  
  local_1098[0x10] = 0x66;
  local_1098[0x11] = 0x69;
  local_1098[0x12] = 0x73;
  local_1098[0x13] = 0x68;
  local_1098[0x14] = 0x53;
  local_1098[0x15] = 0x77;
  local_1098[0x16] = 0x61;
  local_1098[0x17] = 0x74;
  local_1098[0x18] = 0x44;
  local_1098[0x19] = 0x79;
  local_1098[0x1a] = 0x6e;
  local_1098[0x1b] = 0x61;
  local_1098[0x1c] = 0x6d;
  local_1098[0x1d] = 0x69;
  local_1098[0x1e] = 0x74;
  local_1098[0x1f] = 0x65;
  local_1098[0] = 0x4f;
  local_1098[1] = 0x78;
  local_1098[2] = 0x79;
  local_1098[3] = 99;
  local_1098[4] = 0x68;
  local_1098[5] = 0x72;
  local_1098[6] = 0x6f;
  local_1098[7] = 0x6d;
  local_1098[8] = 0x61;
  local_1098[9] = 0x74;
  local_1098[10] = 0x69;
  local_1098[0xb] = 99;
  local_1098[0xc] = 0x42;
  local_1098[0xd] = 0x6c;
  local_1098[0xe] = 0x6f;
  local_1098[0xf] = 0x77;
  local_10a8 = out;
  memcpy(&local_1078,Blowfish_initstate_initstate,0x1048);
  lVar1 = 0;
  uVar2 = 0;
  do {
    cVar5 = '\x04';
    uVar6 = 0;
    do {
      if (0x3f < uVar2) {
        uVar2 = 0;
      }
      uVar6 = (uint)sha2pass[uVar2] | uVar6 << 8;
      uVar2 = uVar2 + 1;
      cVar5 = cVar5 + -1;
    } while (cVar5 != '\0');
    local_1078.P[lVar1] = local_1078.P[lVar1] ^ uVar6;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x12);
  local_10d8[0] = 0;
  local_10dc = 0;
  uVar2 = 0;
  uVar7 = 0;
  local_10b0 = sha2pass;
  do {
    cVar5 = '\x04';
    uVar6 = 0;
    do {
      if (0x3f < uVar2) {
        uVar2 = 0;
      }
      uVar6 = (uint)sha2salt[uVar2] | uVar6 << 8;
      uVar2 = uVar2 + 1;
      cVar5 = cVar5 + -1;
    } while (cVar5 != '\0');
    local_10d8[0] = local_10d8[0] ^ uVar6;
    uVar6 = 0;
    cVar5 = '\x04';
    do {
      if (0x3f < uVar2) {
        uVar2 = 0;
      }
      uVar6 = (uint)sha2salt[uVar2] | uVar6 << 8;
      uVar2 = uVar2 + 1;
      cVar5 = cVar5 + -1;
    } while (cVar5 != '\0');
    local_10dc = local_10dc ^ uVar6;
    Blowfish_encipher(&local_1078,local_10d8,&local_10dc);
    local_1078.P[uVar7] = local_10d8[0];
    local_1078.P[uVar7 + 1] = local_10dc;
    bVar8 = uVar7 < 0x10;
    uVar7 = uVar7 + 2;
  } while (bVar8);
  lVar1 = 0;
  do {
    uVar7 = 0;
    local_10a0 = lVar1;
    do {
      uVar6 = 0;
      cVar5 = '\x04';
      do {
        if (0x3f < uVar2) {
          uVar2 = 0;
        }
        uVar6 = (uint)sha2salt[uVar2] | uVar6 << 8;
        uVar2 = uVar2 + 1;
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      local_10d8[0] = local_10d8[0] ^ uVar6;
      uVar6 = 0;
      cVar5 = '\x04';
      do {
        if (0x3f < uVar2) {
          uVar2 = 0;
        }
        uVar6 = (uint)sha2salt[uVar2] | uVar6 << 8;
        uVar2 = uVar2 + 1;
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      local_10dc = local_10dc ^ uVar6;
      Blowfish_encipher(&local_1078,local_10d8,&local_10dc);
      key = local_10b0;
      local_1078.S[lVar1][uVar7] = local_10d8[0];
      local_1078.S[lVar1][uVar7 + 1] = local_10dc;
      bVar8 = uVar7 < 0xfe;
      uVar7 = uVar7 + 2;
    } while (bVar8);
    lVar1 = local_10a0 + 1;
  } while (lVar1 != 4);
  iVar4 = 0x40;
  uVar3 = extraout_RDX;
  do {
    Blowfish_expand0state(&local_1078,sha2salt,(uint16_t)uVar3);
    Blowfish_expand0state(&local_1078,key,keybytes);
    iVar4 = iVar4 + -1;
    uVar3 = extraout_RDX_00;
  } while (iVar4 != 0);
  lVar1 = 0;
  uVar2 = 0;
  do {
    cVar5 = '\x04';
    uVar6 = 0;
    do {
      if (0x1f < uVar2) {
        uVar2 = 0;
      }
      uVar6 = (uint)local_1098[uVar2] | uVar6 << 8;
      uVar2 = uVar2 + 1;
      cVar5 = cVar5 + -1;
    } while (cVar5 != '\0');
    local_10d8[lVar1] = uVar6;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  iVar4 = 0;
  do {
    lVar1 = 0;
    do {
      Blowfish_encipher(&local_1078,(uint32_t *)((long)local_10d8 + lVar1),
                        (uint32_t *)((long)local_10d8 + lVar1 + 4));
      lVar1 = lVar1 + 8;
    } while ((short)lVar1 != 0x20);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x40);
  lVar1 = 0;
  do {
    *(uint32_t *)(local_10a8 + lVar1 * 4) = local_10d8[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  explicit_bzero(local_1098,0x20);
  explicit_bzero(local_10d8,0x20);
  explicit_bzero(&local_1078,0x1048);
  return;
}

Assistant:

static void
bcrypt_hash(uint8_t *sha2pass, uint8_t *sha2salt, uint8_t *out)
{
    blf_ctx state;
    uint8_t ciphertext[BCRYPT_HASHSIZE] = {
        'O', 'x', 'y', 'c', 'h', 'r', 'o', 'm', 'a', 't', 'i', 'c',
        'B', 'l', 'o', 'w', 'f', 'i', 's', 'h',
        'S', 'w', 'a', 't',
        'D', 'y', 'n', 'a', 'm', 'i', 't', 'e' };
    uint32_t cdata[BCRYPT_BLOCKS];
    int i;
    uint16_t j;
    uint16_t shalen = SHA512_DIGEST_LENGTH;

    /* key expansion */
    Blowfish_initstate(&state);
    Blowfish_expandstate(&state, sha2salt, shalen, sha2pass, shalen);
    for(i = 0; i < 64; i++) {
        Blowfish_expand0state(&state, sha2salt, shalen);
        Blowfish_expand0state(&state, sha2pass, shalen);
    }

    /* encryption */
    j = 0;
    for(i = 0; i < BCRYPT_BLOCKS; i++)
        cdata[i] = Blowfish_stream2word(ciphertext, sizeof(ciphertext),
                                        &j);
    for(i = 0; i < 64; i++)
        blf_enc(&state, cdata, BCRYPT_BLOCKS / 2);

    /* copy out */
    for(i = 0; i < BCRYPT_BLOCKS; i++) {
        out[4 * i + 3] = (uint8_t)((cdata[i] >> 24) & 0xff);
        out[4 * i + 2] = (cdata[i] >> 16) & 0xff;
        out[4 * i + 1] = (cdata[i] >> 8) & 0xff;
        out[4 * i + 0] = cdata[i] & 0xff;
    }

    /* zap */
    _libssh2_explicit_zero(ciphertext, sizeof(ciphertext));
    _libssh2_explicit_zero(cdata, sizeof(cdata));
    _libssh2_explicit_zero(&state, sizeof(state));
}